

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm3.c
# Opt level: O1

void sm3_process(sm3_context *ctx,uint8_t *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint32_t T [64];
  uint32_t W1 [64];
  uint local_348 [68];
  uint auStack_238 [16];
  uint auStack_1f8 [48];
  uint auStack_138 [66];
  
  lVar7 = 0;
  do {
    auStack_238[lVar7] = 0x79cc4519;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x10);
  lVar7 = 0x10;
  do {
    auStack_238[lVar7] = 0x7a879d8a;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x40);
  uVar11 = *(uint *)data;
  local_348[0] = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18
  ;
  uVar11 = *(uint *)(data + 4);
  local_348[1] = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18
  ;
  uVar11 = *(uint *)(data + 8);
  local_348[2] = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18
  ;
  uVar11 = *(uint *)(data + 0xc);
  local_348[3] = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18
  ;
  uVar11 = *(uint *)(data + 0x10);
  local_348[4] = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18
  ;
  uVar11 = *(uint *)(data + 0x14);
  local_348[5] = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18
  ;
  uVar11 = *(uint *)(data + 0x18);
  local_348[6] = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18
  ;
  uVar11 = *(uint *)(data + 0x1c);
  local_348[7] = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18
  ;
  uVar11 = *(uint *)(data + 0x20);
  local_348[8] = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18
  ;
  uVar11 = *(uint *)(data + 0x24);
  local_348[9] = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18
  ;
  uVar11 = *(uint *)(data + 0x28);
  local_348[10] =
       uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
  uVar11 = *(uint *)(data + 0x2c);
  local_348[0xb] =
       uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
  uVar11 = *(uint *)(data + 0x30);
  local_348[0xc] =
       uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
  uVar11 = *(uint *)(data + 0x34);
  local_348[0xd] =
       uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
  uVar11 = *(uint *)(data + 0x38);
  local_348[0xe] =
       uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
  uVar11 = *(uint *)(data + 0x3c);
  local_348[0xf] =
       uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
  lVar7 = 0;
  do {
    uVar11 = (local_348[lVar7 + 0xd] << 0xf | local_348[lVar7 + 0xd] >> 0x11) ^
             local_348[lVar7 + 7] ^ local_348[lVar7];
    local_348[lVar7 + 0x10] =
         (local_348[lVar7 + 3] << 7 | local_348[lVar7 + 3] >> 0x19) ^ local_348[lVar7 + 10] ^
         (uVar11 << 0x17 | uVar11 >> 9) ^ (uVar11 << 0xf | uVar11 >> 0x11) ^ uVar11;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x34);
  lVar7 = 0;
  do {
    auStack_138[lVar7] = local_348[lVar7 + 4] ^ local_348[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x40);
  uVar11 = ctx->state[1];
  uVar1 = ctx->state[3];
  uVar2 = ctx->state[4];
  uVar3 = ctx->state[5];
  uVar4 = ctx->state[6];
  uVar5 = ctx->state[7];
  lVar7 = 0;
  uVar13 = ctx->state[0];
  uVar9 = uVar11;
  uVar15 = ctx->state[2];
  uVar19 = uVar1;
  uVar12 = uVar2;
  uVar18 = uVar3;
  uVar20 = uVar4;
  uVar8 = uVar5;
  do {
    uVar21 = uVar20;
    uVar17 = uVar12;
    uVar14 = uVar15;
    uVar10 = uVar13;
    uVar13 = uVar10 << 0xc | uVar10 >> 0x14;
    bVar6 = (byte)lVar7 & 0x1f;
    uVar15 = (auStack_238[lVar7] << bVar6 | auStack_238[lVar7] >> 0x20 - bVar6) + uVar13 + uVar17;
    uVar16 = uVar15 * 0x80 | uVar15 >> 0x19;
    uVar15 = uVar9 << 9 | uVar9 >> 0x17;
    uVar20 = uVar18 << 0x13 | uVar18 >> 0xd;
    uVar12 = (uVar18 ^ uVar17 ^ uVar21) + uVar8 + local_348[lVar7] + uVar16;
    uVar13 = (uVar14 ^ uVar9 ^ uVar10) + uVar19 + auStack_138[lVar7] + (uVar13 ^ uVar16);
    uVar12 = (uVar12 * 0x20000 | uVar12 >> 0xf) ^ (uVar12 * 0x200 | uVar12 >> 0x17) ^ uVar12;
    lVar7 = lVar7 + 1;
    uVar9 = uVar10;
    uVar19 = uVar14;
    uVar18 = uVar17;
    uVar8 = uVar21;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  do {
    uVar8 = uVar20;
    uVar19 = uVar12;
    uVar9 = uVar15;
    uVar16 = uVar13;
    uVar13 = uVar16 << 0xc | uVar16 >> 0x14;
    bVar6 = (char)lVar7 + 0x10U & 0x1f;
    uVar15 = (auStack_1f8[lVar7] << bVar6 | auStack_1f8[lVar7] >> 0x20 - bVar6) + uVar13 + uVar19;
    uVar18 = uVar15 * 0x80 | uVar15 >> 0x19;
    uVar15 = uVar10 << 9 | uVar10 >> 0x17;
    uVar20 = uVar17 << 0x13 | uVar17 >> 0xd;
    uVar12 = ((uVar17 ^ uVar8) & uVar19 ^ uVar8) + uVar21 + local_348[lVar7 + 0x10] + uVar18;
    uVar13 = (uVar9 & uVar10 | (uVar9 | uVar10) & uVar16) + uVar14 + auStack_138[lVar7 + 0x10] +
             (uVar13 ^ uVar18);
    uVar12 = (uVar12 * 0x20000 | uVar12 >> 0xf) ^ (uVar12 * 0x200 | uVar12 >> 0x17) ^ uVar12;
    lVar7 = lVar7 + 1;
    uVar10 = uVar16;
    uVar14 = uVar9;
    uVar17 = uVar19;
    uVar21 = uVar8;
  } while (lVar7 != 0x30);
  ctx->state[0] = uVar13 ^ ctx->state[0];
  ctx->state[1] = uVar16 ^ uVar11;
  ctx->state[2] = uVar15 ^ ctx->state[2];
  ctx->state[3] = uVar9 ^ uVar1;
  ctx->state[4] = uVar12 ^ uVar2;
  ctx->state[5] = uVar19 ^ uVar3;
  ctx->state[6] = uVar20 ^ uVar4;
  ctx->state[7] = uVar8 ^ uVar5;
  return;
}

Assistant:

static void sm3_process(struct sm3_context *ctx, const uint8_t data[64])
{
	uint32_t SS1, SS2, TT1, TT2, W[68], W1[64];
	uint32_t A, B, C, D, E, F, G, H;
	uint32_t T[64];
	uint32_t Temp1, Temp2, Temp3, Temp4, Temp5;
	int j;

	for (j = 0; j < 16; j++)
		T[j] = 0x79CC4519;
	for (j = 16; j < 64; j++)
		T[j] = 0x7A879D8A;

	GET_UINT32_BE(W[0], data,  0);
	GET_UINT32_BE(W[1], data,  4);
	GET_UINT32_BE(W[2], data,  8);
	GET_UINT32_BE(W[3], data, 12);
	GET_UINT32_BE(W[4], data, 16);
	GET_UINT32_BE(W[5], data, 20);
	GET_UINT32_BE(W[6], data, 24);
	GET_UINT32_BE(W[7], data, 28);
	GET_UINT32_BE(W[8], data, 32);
	GET_UINT32_BE(W[9], data, 36);
	GET_UINT32_BE(W[10], data, 40);
	GET_UINT32_BE(W[11], data, 44);
	GET_UINT32_BE(W[12], data, 48);
	GET_UINT32_BE(W[13], data, 52);
	GET_UINT32_BE(W[14], data, 56);
	GET_UINT32_BE(W[15], data, 60);

#define FF0(x, y, z)	((x) ^ (y) ^ (z))
#define FF1(x, y, z)	(((x) & (y)) | ((x) & (z)) | ((y) & (z)))

#define GG0(x, y, z)	((x) ^ (y) ^ (z))
#define GG1(x, y, z)	(((x) & (y)) | ((~(x)) & (z)))

#define SHL(x, n)	((x) << (n))
#define ROTL(x, y) ( (((uint32_t)(x)<<(uint32_t)((y)&31)) | (((uint32_t)(x)&0xFFFFFFFFUL)>>(uint32_t)((32-((y)&31))&31))) & 0xFFFFFFFFUL)

#define P0(x)	((x) ^ ROTL((x), 9) ^ ROTL((x), 17))
#define P1(x)	((x) ^ ROTL((x), 15) ^ ROTL((x), 23))

	for (j = 16; j < 68; j++) {
		/*
		 * W[j] = P1( W[j-16] ^ W[j-9] ^ ROTL(W[j-3],15)) ^
		 *        ROTL(W[j - 13],7 ) ^ W[j-6];
		 */

		Temp1 = W[j - 16] ^ W[j - 9];
		Temp2 = ROTL(W[j - 3], 15);
		Temp3 = Temp1 ^ Temp2;
		Temp4 = P1(Temp3);
		Temp5 =  ROTL(W[j - 13], 7) ^ W[j - 6];
		W[j] = Temp4 ^ Temp5;
	}

	for (j =  0; j < 64; j++)
		W1[j] = W[j] ^ W[j + 4];

	A = ctx->state[0];
	B = ctx->state[1];
	C = ctx->state[2];
	D = ctx->state[3];
	E = ctx->state[4];
	F = ctx->state[5];
	G = ctx->state[6];
	H = ctx->state[7];

	for (j = 0; j < 16; j++) {
		SS1 = ROTL(ROTL(A, 12) + E + ROTL(T[j], j), 7);
		SS2 = SS1 ^ ROTL(A, 12);
		TT1 = FF0(A, B, C) + D + SS2 + W1[j];
		TT2 = GG0(E, F, G) + H + SS1 + W[j];
		D = C;
		C = ROTL(B, 9);
		B = A;
		A = TT1;
		H = G;
		G = ROTL(F, 19);
		F = E;
		E = P0(TT2);
	}

	for (j = 16; j < 64; j++) {
		SS1 = ROTL(ROTL(A, 12) + E + ROTL(T[j], j), 7);
		SS2 = SS1 ^ ROTL(A, 12);
		TT1 = FF1(A, B, C) + D + SS2 + W1[j];
		TT2 = GG1(E, F, G) + H + SS1 + W[j];
		D = C;
		C = ROTL(B, 9);
		B = A;
		A = TT1;
		H = G;
		G = ROTL(F, 19);
		F = E;
		E = P0(TT2);
	}

	ctx->state[0] ^= A;
	ctx->state[1] ^= B;
	ctx->state[2] ^= C;
	ctx->state[3] ^= D;
	ctx->state[4] ^= E;
	ctx->state[5] ^= F;
	ctx->state[6] ^= G;
	ctx->state[7] ^= H;
}